

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::MatchRepeatedFieldIndices
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,MapKeyComparator *key_comparator,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,vector<int,_std::allocator<int>_> *match_list1,
          vector<int,_std::allocator<int>_> *match_list2)

{
  int32_t iVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  reference pvVar6;
  uint *puVar7;
  long lVar8;
  size_type sVar9;
  MapKeyComparator *pMVar10;
  int iVar11;
  size_type __n;
  long lVar12;
  int index2;
  MapKeyComparator *__n_00;
  byte bVar13;
  size_type sVar14;
  bool bVar15;
  Metadata MVar16;
  int local_14c;
  int unpacked_any_local;
  allocator_type local_139;
  Reporter *local_138;
  Message *local_130;
  Message *local_128;
  MapKeyComparator *local_120;
  size_type local_118;
  MapKeyComparator *key_comparator_local;
  vector<int,_std::allocator<int>_> num_diffs_list1;
  FieldDescriptor *repeated_field_local;
  NumDiffsReporter num_diffs_reporter;
  _Any_data local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  MaximumMatcher local_b0;
  vector<bool,_std::allocator<bool>_> visited;
  
  unpacked_any_local = unpacked_any;
  local_120 = key_comparator;
  key_comparator_local = key_comparator;
  repeated_field_local = repeated_field;
  MVar16 = Message::GetMetadata(message1);
  local_130 = message1;
  uVar4 = Reflection::FieldSize(MVar16.reflection,message1,repeated_field);
  MVar16 = Message::GetMetadata(message2);
  local_128 = message2;
  uVar5 = Reflection::FieldSize(MVar16.reflection,message2,repeated_field);
  bVar2 = IsTreatedAsSmartSet(this,repeated_field);
  sVar9 = (size_type)(int)uVar4;
  local_b0.count1_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(match_list1,sVar9,&local_b0.count1_);
  __n = (size_type)(int)uVar5;
  local_b0.count1_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(match_list2,__n,&local_b0.count1_);
  pMVar10 = local_120;
  local_138 = this->reporter_;
  local_118 = sVar9;
  if ((uVar5 == 1 && uVar4 == 1) &&
     (local_138 == (Reporter *)0x0 && local_120 == (MapKeyComparator *)0x0)) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list1,0);
    *pvVar6 = 0;
    pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list2,0);
    *pvVar6 = 0;
    return true;
  }
  this->reporter_ = (Reporter *)0x0;
  num_diffs_reporter.super_Reporter._vptr_Reporter = (_func_int **)&PTR__Reporter_004b1bf8;
  num_diffs_reporter.num_diffs_ = 0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (bVar2) {
    local_b0.count1_ = 0x7fffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&num_diffs_list1,sVar9,&local_b0.count1_)
    ;
  }
  if (this->scope_ == PARTIAL) {
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8._M_unused._M_object = operator_new(0x38);
    *(MessageDifferencer **)local_d8._M_unused._0_8_ = this;
    *(FieldDescriptor ***)((long)local_d8._M_unused._0_8_ + 8) = &repeated_field_local;
    *(MapKeyComparator ***)((long)local_d8._M_unused._0_8_ + 0x10) = &key_comparator_local;
    *(Message **)((long)local_d8._M_unused._0_8_ + 0x18) = local_130;
    *(Message **)((long)local_d8._M_unused._0_8_ + 0x20) = local_128;
    *(int **)((long)local_d8._M_unused._0_8_ + 0x28) = &unpacked_any_local;
    local_b0.count1_ = (int)local_118;
    local_b0.match_callback_._M_invoker =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc:1958:21)>
         ::_M_invoke;
    local_b0.match_callback_.super__Function_base._M_functor._8_8_ = local_d8._8_8_;
    local_b0.match_callback_.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc:1958:21)>
         ::_M_manager;
    local_b0.cached_match_results_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_b0.cached_match_results_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    *(vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      **)((long)local_d8._M_unused._0_8_ + 0x30) = parent_fields;
    local_c8 = 0;
    uStack_c0 = 0;
    local_b0.match_list1_ = match_list1;
    local_b0.match_list2_ = match_list2;
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = 0xffffffff;
    local_b0.count2_ = uVar5;
    local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ =
         local_d8._M_unused._M_object;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (match_list1,local_118,(value_type_conflict3 *)&visited);
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (match_list2,__n,(value_type_conflict3 *)&visited);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    uVar5 = 0;
    for (iVar11 = 0; iVar11 < local_b0.count1_; iVar11 = iVar11 + 1) {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)
                 &visited.super__Bvector_base<std::allocator<bool>_>,(long)local_b0.count1_,
                 &local_139);
      bVar2 = anon_unknown_5::MaximumMatcher::FindArgumentPathDFS
                        (&local_b0,iVar11,
                         (vector<bool,_std::allocator<bool>_> *)
                         &visited.super__Bvector_base<std::allocator<bool>_>);
      bVar15 = local_138 == (Reporter *)0x0;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&visited.super__Bvector_base<std::allocator<bool>_>);
      if (bVar15 && !bVar2) {
        uVar5 = 0;
        goto LAB_002def40;
      }
      uVar5 = uVar5 + bVar2;
    }
    for (lVar8 = 0; lVar8 < local_b0.count2_; lVar8 = lVar8 + 1) {
      lVar12 = (long)((local_b0.match_list2_)->super__Vector_base<int,_std::allocator<int>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar8];
      if (lVar12 != -1) {
        ((local_b0.match_list1_)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar12] = (int)lVar8;
      }
    }
LAB_002def40:
    bVar15 = uVar5 == uVar4;
    anon_unknown_5::MaximumMatcher::~MaximumMatcher(&local_b0);
    repeated_field = repeated_field_local;
    if ((local_138 == (Reporter *)0x0) && (uVar5 != uVar4)) {
LAB_002def65:
      bVar15 = false;
      goto LAB_002df211;
    }
  }
  else {
    bVar15 = IsTreatedAsSet(this,repeated_field);
    if ((bVar15 || bVar2) || (bVar15 = IsTreatedAsSmartList(this,repeated_field), bVar15)) {
      if ((int)uVar5 < (int)uVar4) {
        uVar4 = uVar5;
      }
      sVar9 = 0;
      sVar14 = 0;
      if (0 < (int)uVar4) {
        sVar14 = (size_type)uVar4;
      }
      for (; uVar5 = uVar4, sVar14 != sVar9; sVar9 = sVar9 + 1) {
        uVar5 = (uint)sVar9;
        bVar15 = IsMatch(this,repeated_field,pMVar10,local_130,local_128,unpacked_any,parent_fields,
                         (Reporter *)0x0,uVar5,uVar5);
        if (!bVar15) break;
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::at(match_list1,sVar9);
        *puVar7 = uVar5;
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::at(match_list2,sVar9);
        *puVar7 = uVar5;
      }
      pMVar10 = (MapKeyComparator *)(long)(int)uVar5;
    }
    else {
      pMVar10 = (MapKeyComparator *)0x0;
    }
    bVar15 = true;
    local_120 = pMVar10;
    for (; (long)pMVar10 < (long)local_118;
        pMVar10 = (MapKeyComparator *)((long)&pMVar10->_vptr_MapKeyComparator + 1)) {
      local_14c = -1;
      for (__n_00 = local_120; iVar11 = (int)pMVar10, (long)__n_00 < (long)__n;
          __n_00 = (MapKeyComparator *)((long)&__n_00->_vptr_MapKeyComparator + 1)) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list2,(size_type)__n_00);
        index2 = (int)__n_00;
        if (*pvVar6 == -1) {
          if (bVar2) goto LAB_002df01f;
          bVar3 = IsMatch(this,repeated_field,key_comparator_local,local_130,local_128,
                          unpacked_any_local,parent_fields,(Reporter *)0x0,iVar11,index2);
          if (bVar3) {
            if (__n_00 == (MapKeyComparator *)0xffffffffffffffff) goto LAB_002df1ac;
            bVar13 = 1;
            local_14c = index2;
            goto LAB_002df182;
          }
        }
        else if (((bVar2) &&
                 (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pMVar10] != 0)) &&
                (pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list2,(size_type)__n_00),
                num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[*pvVar6] != 0)) {
LAB_002df01f:
          num_diffs_reporter.num_diffs_ = 0;
          bVar3 = IsMatch(this,repeated_field,key_comparator_local,local_130,local_128,
                          unpacked_any_local,parent_fields,&num_diffs_reporter.super_Reporter,iVar11
                          ,index2);
          iVar1 = num_diffs_reporter.num_diffs_;
          if (bVar3) {
            num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)pMVar10] = 0;
          }
          else if ((((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)repeated_field->type_ * 4
                              ) != 10) ||
                    (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pMVar10] <=
                     num_diffs_reporter.num_diffs_)) ||
                   ((pvVar6 = std::vector<int,_std::allocator<int>_>::at
                                        (match_list2,(size_type)__n_00), *pvVar6 != -1 &&
                    (pvVar6 = std::vector<int,_std::allocator<int>_>::at
                                        (match_list2,(size_type)__n_00),
                    num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[*pvVar6] <= iVar1)))) ||
                  (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pMVar10] = iVar1, local_14c = index2,
                  iVar1 != 0)) goto LAB_002df0f8;
          local_14c = index2;
          if (__n_00 == (MapKeyComparator *)0xffffffffffffffff) goto LAB_002df1ac;
          goto LAB_002df12d;
        }
LAB_002df0f8:
      }
      if (local_14c == -1) {
LAB_002df1ac:
        bVar13 = 0;
      }
      else {
        bVar13 = 1;
        if (bVar2) {
LAB_002df12d:
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_14c);
          if (*pvVar6 == -1) {
            bVar13 = 1;
          }
          else {
            pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_14c);
            pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list1,(long)*pvVar6);
            *pvVar6 = -1;
            bVar13 = 0;
          }
        }
LAB_002df182:
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list1,(size_type)pMVar10);
        *pvVar6 = local_14c;
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_14c);
        *pvVar6 = iVar11;
      }
      if ((local_138 != (Reporter *)0x0 | bVar13) != 1) goto LAB_002def65;
      bVar15 = (bool)(bVar13 & bVar15);
    }
  }
  bVar2 = IsTreatedAsSmartList(this,repeated_field);
  if (bVar2) {
    std::
    function<void_(std::vector<int,_std::allocator<int>_>_*,_std::vector<int,_std::allocator<int>_>_*)>
    ::operator()(&this->match_indices_for_smart_list_callback_,match_list1,match_list2);
  }
  this->reporter_ = local_138;
LAB_002df211:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>);
  return bVar15;
}

Assistant:

bool MessageDifferencer::MatchRepeatedFieldIndices(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    const MapKeyComparator* key_comparator,
    const std::vector<SpecificField>& parent_fields,
    std::vector<int>* match_list1, std::vector<int>* match_list2) {
  const int count1 =
      message1.GetReflection()->FieldSize(message1, repeated_field);
  const int count2 =
      message2.GetReflection()->FieldSize(message2, repeated_field);
  const bool is_treated_as_smart_set = IsTreatedAsSmartSet(repeated_field);

  match_list1->assign(count1, -1);
  match_list2->assign(count2, -1);

  // In the special case where both repeated fields have exactly one element,
  // return without calling the comparator.  This optimization prevents the
  // pathological case of deeply nested repeated fields of size 1 from taking
  // exponential-time to compare.
  //
  // In the case where reporter_ is set, we need to do the compare here to
  // properly distinguish a modify from an add+delete.  The code below will not
  // pass the reporter along in recursive calls to nested repeated fields, so
  // the inner call will have the opportunity to perform this optimization and
  // avoid exponential-time behavior.
  //
  // In the case where key_comparator is set, we need to do the compare here to
  // fulfill the interface contract that keys will be compared even if the user
  // asked to ignore that field.  The code will only compare the key fields
  // which (hopefully) do not contain further repeated fields.
  if (count1 == 1 && count2 == 1 && reporter_ == nullptr &&
      key_comparator == nullptr) {
    match_list1->at(0) = 0;
    match_list2->at(0) = 0;
    return true;
  }

  // Ensure that we don't report differences during the matching process. Since
  // field comparators could potentially use this message differencer object to
  // perform further comparisons, turn off reporting here and re-enable it
  // before returning.
  Reporter* reporter = reporter_;
  reporter_ = NULL;
  NumDiffsReporter num_diffs_reporter;
  std::vector<int32_t> num_diffs_list1;
  if (is_treated_as_smart_set) {
    num_diffs_list1.assign(count1, std::numeric_limits<int32_t>::max());
  }

  bool success = true;
  // Find potential match if this is a special repeated field.
  if (scope_ == PARTIAL) {
    // When partial matching is enabled, Compare(a, b) && Compare(a, c)
    // doesn't necessarily imply Compare(b, c). Therefore a naive greedy
    // algorithm will fail to find a maximum matching.
    // Here we use the augmenting path algorithm.
    auto callback = [&](int i1, int i2) {
      return IsMatch(repeated_field, key_comparator, &message1, &message2,
                     unpacked_any, parent_fields, nullptr, i1, i2);
    };
    MaximumMatcher matcher(count1, count2, std::move(callback), match_list1,
                           match_list2);
    // If diff info is not needed, we should end the matching process as
    // soon as possible if not all items can be matched.
    bool early_return = (reporter == nullptr);
    int match_count = matcher.FindMaximumMatch(early_return);
    if (match_count != count1 && early_return) return false;
    success = success && (match_count == count1);
  } else {
    int start_offset = 0;
    // If the two repeated fields are treated as sets, optimize for the case
    // where both start with same items stored in the same order.
    if (IsTreatedAsSet(repeated_field) || is_treated_as_smart_set ||
        IsTreatedAsSmartList(repeated_field)) {
      start_offset = std::min(count1, count2);
      for (int i = 0; i < count1 && i < count2; i++) {
        if (IsMatch(repeated_field, key_comparator, &message1, &message2,
                    unpacked_any, parent_fields, nullptr, i, i)) {
          match_list1->at(i) = i;
          match_list2->at(i) = i;
        } else {
          start_offset = i;
          break;
        }
      }
    }
    for (int i = start_offset; i < count1; ++i) {
      // Indicates any matched elements for this repeated field.
      bool match = false;
      int matched_j = -1;

      for (int j = start_offset; j < count2; j++) {
        if (match_list2->at(j) != -1) {
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0 ||
              num_diffs_list1[match_list2->at(j)] == 0) {
            continue;
          }
        }

        if (is_treated_as_smart_set) {
          num_diffs_reporter.Reset();
          match =
              IsMatch(repeated_field, key_comparator, &message1, &message2,
                      unpacked_any, parent_fields, &num_diffs_reporter, i, j);
        } else {
          match = IsMatch(repeated_field, key_comparator, &message1, &message2,
                          unpacked_any, parent_fields, nullptr, i, j);
        }

        if (is_treated_as_smart_set) {
          if (match) {
            num_diffs_list1[i] = 0;
          } else if (repeated_field->cpp_type() ==
                     FieldDescriptor::CPPTYPE_MESSAGE) {
            // Replace with the one with fewer diffs.
            const int32_t num_diffs = num_diffs_reporter.GetNumDiffs();
            if (num_diffs < num_diffs_list1[i]) {
              // If j has been already matched to some element, ensure the
              // current num_diffs is smaller.
              if (match_list2->at(j) == -1 ||
                  num_diffs < num_diffs_list1[match_list2->at(j)]) {
                num_diffs_list1[i] = num_diffs;
                match = true;
              }
            }
          }
        }

        if (match) {
          matched_j = j;
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0) {
            break;
          }
        }
      }

      match = (matched_j != -1);
      if (match) {
        if (is_treated_as_smart_set && match_list2->at(matched_j) != -1) {
          // This is to revert the previously matched index in list2.
          match_list1->at(match_list2->at(matched_j)) = -1;
          match = false;
        }
        match_list1->at(i) = matched_j;
        match_list2->at(matched_j) = i;
      }
      if (!match && reporter == nullptr) return false;
      success = success && match;
    }
  }

  if (IsTreatedAsSmartList(repeated_field)) {
    match_indices_for_smart_list_callback_(match_list1, match_list2);
  }

  reporter_ = reporter;

  return success;
}